

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O3

void __thiscall
Eigen::SparseMatrix<float,1,int>::reserveInnerVectors<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseMatrix<float,1,int> *this,Matrix<int,__1,_1,_0,__1,_1> *reserveSizes)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  void *__ptr;
  bool bVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  long lVar12;
  int iVar13;
  Index size;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  
  uVar17 = *(ulong *)(this + 8);
  lVar4 = *(long *)(this + 0x20);
  if (lVar4 != 0) {
    pvVar8 = malloc(uVar17 * 4 + 4);
    if (pvVar8 != (void *)0x0) {
      if ((long)uVar17 < 1) {
        iVar13 = 0;
      }
      else {
        piVar5 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        uVar25 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows;
        lVar6 = *(long *)(this + 0x18);
        uVar23 = 0;
        if ((long)uVar25 < 1) {
          uVar25 = uVar23;
        }
        iVar13 = 0;
        do {
          *(int *)((long)pvVar8 + uVar23 * 4) = iVar13;
          if (uVar25 == uVar23) goto LAB_0016fa91;
          lVar9 = uVar23 * 4;
          iVar21 = *(int *)(lVar4 + uVar23 * 4);
          lVar1 = uVar23 * 4;
          iVar2 = piVar5[uVar23];
          uVar23 = uVar23 + 1;
          iVar14 = *(int *)(lVar6 + 4 + lVar9) - (*(int *)(lVar6 + lVar1) + iVar21);
          if (iVar14 < iVar2) {
            iVar14 = iVar2;
          }
          iVar13 = iVar13 + iVar21 + iVar14;
        } while (uVar17 != uVar23);
      }
      *(int *)((long)pvVar8 + uVar17 * 4) = iVar13;
      internal::CompressedStorage<float,_int>::resize
                ((CompressedStorage<float,_int> *)(this + 0x28),(long)iVar13,0.0);
      __ptr = *(void **)(this + 0x18);
      if (0 < *(long *)(this + 8)) {
        lVar4 = *(long *)(this + 0x20);
        lVar6 = *(long *)(this + 0x28);
        lVar1 = *(long *)(this + 0x30);
        lVar9 = *(long *)(this + 8);
        do {
          lVar10 = lVar9 + -1;
          iVar13 = *(int *)((long)pvVar8 + lVar9 * 4 + -4);
          uVar15 = *(uint *)((long)__ptr + lVar9 * 4 + -4);
          uVar17 = (ulong)uVar15;
          if (((int)uVar15 < iVar13) && (iVar21 = *(int *)(lVar4 + lVar10 * 4), 0 < iVar21)) {
            lVar18 = (ulong)(iVar21 - 1) * 4;
            lVar19 = lVar1 + (long)iVar13 * 4;
            lVar24 = lVar6 + (long)iVar13 * 4;
            lVar20 = -4;
            lVar12 = lVar1;
            lVar22 = lVar6;
            do {
              *(undefined4 *)(lVar19 + lVar18) =
                   *(undefined4 *)(lVar12 + lVar18 + (long)(int)uVar17 * 4);
              uVar17 = (ulong)*(int *)((long)__ptr + lVar10 * 4);
              *(undefined4 *)(lVar24 + lVar18) = *(undefined4 *)(lVar22 + lVar18 + uVar17 * 4);
              lVar20 = lVar20 + 4;
              lVar19 = lVar19 + -4;
              lVar12 = lVar12 + -4;
              lVar24 = lVar24 + -4;
              lVar22 = lVar22 + -4;
            } while (lVar18 != lVar20);
          }
          bVar7 = 1 < lVar9;
          lVar9 = lVar10;
        } while (bVar7);
      }
      *(void **)(this + 0x18) = pvVar8;
      free(__ptr);
      return;
    }
LAB_0016fab0:
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = boost::program_options::detail::cmdline::cmdline;
    __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  pvVar8 = malloc(uVar17 * 4);
  *(void **)(this + 0x20) = pvVar8;
  if (pvVar8 == (void *)0x0) goto LAB_0016fab0;
  uVar23 = 0;
  if ((long)uVar17 < 1) {
    size = 0;
  }
  else {
    piVar5 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar25 = (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    lVar4 = *(long *)(this + 0x18);
    if ((long)uVar25 < 1) {
      uVar25 = uVar23;
    }
    size = 0;
    uVar16 = 0;
    do {
      *(int *)((long)pvVar8 + uVar16 * 4) = (int)uVar23;
      if (uVar25 == uVar16) goto LAB_0016fa91;
      iVar13 = piVar5[uVar16];
      uVar23 = (ulong)(uint)(((int)uVar23 + iVar13 + *(int *)(lVar4 + 4 + uVar16 * 4)) -
                            *(int *)(lVar4 + uVar16 * 4));
      uVar16 = uVar16 + 1;
      size = size + iVar13;
    } while (uVar17 != uVar16);
  }
  internal::CompressedStorage<float,_int>::reserve
            ((CompressedStorage<float,_int> *)(this + 0x28),size);
  lVar4 = *(long *)(this + 8);
  lVar6 = *(long *)(this + 0x18);
  if (0 < lVar4) {
    uVar15 = *(uint *)(lVar6 + lVar4 * 4);
    lVar1 = *(long *)(this + 0x30);
    lVar9 = *(long *)(this + 0x20);
    lVar10 = *(long *)(this + 0x28);
    lVar19 = lVar4;
    do {
      lVar24 = lVar19 + -1;
      uVar3 = *(uint *)(lVar6 + -4 + lVar19 * 4);
      uVar17 = (ulong)uVar3;
      iVar13 = uVar15 - uVar3;
      if (iVar13 == 0 || (int)uVar15 < (int)uVar3) {
        iVar21 = *(int *)((long)pvVar8 + lVar24 * 4);
        uVar15 = uVar3;
      }
      else {
        uVar25 = (ulong)(iVar13 - 1);
        uVar23 = (ulong)*(uint *)((long)pvVar8 + lVar24 * 4);
        lVar12 = lVar1 + uVar25 * 4;
        lVar22 = lVar10 + uVar25 * 4;
        uVar25 = ~uVar25;
        do {
          *(undefined4 *)(lVar12 + (long)(int)uVar23 * 4) =
               *(undefined4 *)(lVar12 + (long)(int)uVar17 * 4);
          uVar15 = *(uint *)(lVar6 + lVar24 * 4);
          uVar17 = (ulong)(int)uVar15;
          iVar21 = *(int *)((long)pvVar8 + lVar24 * 4);
          uVar23 = (ulong)iVar21;
          *(undefined4 *)(lVar22 + uVar23 * 4) = *(undefined4 *)(lVar22 + uVar17 * 4);
          lVar12 = lVar12 + -4;
          lVar22 = lVar22 + -4;
          uVar25 = uVar25 + 1;
        } while (uVar25 != 0);
      }
      *(int *)(lVar6 + lVar24 * 4) = iVar21;
      *(int *)(lVar9 + lVar24 * 4) = iVar13;
      bVar7 = 1 < lVar19;
      lVar19 = lVar24;
    } while (bVar7);
    if (0 < lVar4) {
      if ((reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows < lVar4) {
LAB_0016fa91:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0xa3,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<int, -1, 1>, Level = 0]"
                     );
      }
      iVar13 = *(int *)(*(long *)(this + 0x20) + -4 + lVar4 * 4) + *(int *)(lVar6 + -4 + lVar4 * 4)
               + (reserveSizes->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data[lVar4 + -1];
      *(int *)(lVar6 + lVar4 * 4) = iVar13;
      goto LAB_0016fa75;
    }
  }
  iVar13 = *(int *)(lVar6 + lVar4 * 4);
LAB_0016fa75:
  internal::CompressedStorage<float,_int>::resize
            ((CompressedStorage<float,_int> *)(this + 0x28),(long)iVar13,0.0);
  return;
}

Assistant:

inline void reserveInnerVectors(const SizesType& reserveSizes)
    {
      if(isCompressed())
      {
        Index totalReserveSize = 0;
        // turn the matrix into non-compressed mode
        m_innerNonZeros = static_cast<StorageIndex*>(std::malloc(m_outerSize * sizeof(StorageIndex)));
        if (!m_innerNonZeros) internal::throw_std_bad_alloc();
        
        // temporarily use m_innerSizes to hold the new starting points.
        StorageIndex* newOuterIndex = m_innerNonZeros;
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          count += reserveSizes[j] + (m_outerIndex[j+1]-m_outerIndex[j]);
          totalReserveSize += reserveSizes[j];
        }
        m_data.reserve(totalReserveSize);
        StorageIndex previousOuterIndex = m_outerIndex[m_outerSize];
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          StorageIndex innerNNZ = previousOuterIndex - m_outerIndex[j];
          for(Index i=innerNNZ-1; i>=0; --i)
          {
            m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
            m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
          }
          previousOuterIndex = m_outerIndex[j];
          m_outerIndex[j] = newOuterIndex[j];
          m_innerNonZeros[j] = innerNNZ;
        }
        if(m_outerSize>0)
          m_outerIndex[m_outerSize] = m_outerIndex[m_outerSize-1] + m_innerNonZeros[m_outerSize-1] + reserveSizes[m_outerSize-1];
        
        m_data.resize(m_outerIndex[m_outerSize]);
      }
      else
      {
        StorageIndex* newOuterIndex = static_cast<StorageIndex*>(std::malloc((m_outerSize+1)*sizeof(StorageIndex)));
        if (!newOuterIndex) internal::throw_std_bad_alloc();
        
        StorageIndex count = 0;
        for(Index j=0; j<m_outerSize; ++j)
        {
          newOuterIndex[j] = count;
          StorageIndex alreadyReserved = (m_outerIndex[j+1]-m_outerIndex[j]) - m_innerNonZeros[j];
          StorageIndex toReserve = std::max<StorageIndex>(reserveSizes[j], alreadyReserved);
          count += toReserve + m_innerNonZeros[j];
        }
        newOuterIndex[m_outerSize] = count;
        
        m_data.resize(count);
        for(Index j=m_outerSize-1; j>=0; --j)
        {
          Index offset = newOuterIndex[j] - m_outerIndex[j];
          if(offset>0)
          {
            StorageIndex innerNNZ = m_innerNonZeros[j];
            for(Index i=innerNNZ-1; i>=0; --i)
            {
              m_data.index(newOuterIndex[j]+i) = m_data.index(m_outerIndex[j]+i);
              m_data.value(newOuterIndex[j]+i) = m_data.value(m_outerIndex[j]+i);
            }
          }
        }
        
        std::swap(m_outerIndex, newOuterIndex);
        std::free(newOuterIndex);
      }
      
    }